

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O0

void __thiscall CppLogger::CppLogger::setFormat(CppLogger *this,Format *t_Format)

{
  bool bVar1;
  Format *format;
  Format *__end1;
  Format *__begin1;
  Format_0_ *__range1;
  __normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
  local_78;
  FormatAttribute local_70 [4];
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_60;
  FormatAttribute *local_48;
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_40;
  __normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
  local_28;
  __normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
  local_20;
  Format *local_18;
  Format *t_Format_local;
  CppLogger *this_local;
  
  local_18 = t_Format;
  t_Format_local = (Format *)this;
  Format::getFormat(&local_40,t_Format);
  local_28._M_current =
       (FormatAttribute *)
       std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::begin
                 (&local_40);
  Format::getFormat(&local_60,local_18);
  local_48 = (FormatAttribute *)
             std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
             end(&local_60);
  local_70[0] = Message;
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<CppLogger::FormatAttribute*,std::vector<CppLogger::FormatAttribute,std::allocator<CppLogger::FormatAttribute>>>,CppLogger::FormatAttribute>
                       (local_28,(__normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
                                  )local_48,local_70);
  Format::getFormat((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                     *)&__range1,local_18);
  local_78._M_current =
       (FormatAttribute *)
       std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::end
                 ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *
                  )&__range1);
  bVar1 = __gnu_cxx::
          operator==<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
                    (&local_20,&local_78);
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::~vector
            ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
             &__range1);
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::~vector
            (&local_60);
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::~vector
            (&local_40);
  if (bVar1) {
    Format::addMessage(local_18);
  }
  for (__end1 = (Format *)&this->field_0x28; __end1 != (Format *)&this->m_ExitOnFatal;
      __end1 = __end1 + 1) {
    Format::operator=(__end1,local_18);
  }
  return;
}

Assistant:

void CppLogger::setFormat(Format& t_Format) {
        if (std::find(t_Format.getFormat().begin(), t_Format.getFormat().end(), FormatAttribute::Message) == t_Format.getFormat().end()) {
            t_Format.addMessage();
        }
        for (auto &format : m_Format) {
            format = t_Format;
        }
    }